

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

void cram_ref_incr_locked(refs_t *r,int id)

{
  int id_local;
  refs_t *r_local;
  
  if ((-1 < id) && (r->ref_id[id]->seq != (char *)0x0)) {
    if (r->last_id == id) {
      r->last_id = -1;
    }
    r->ref_id[id]->count = r->ref_id[id]->count + 1;
  }
  return;
}

Assistant:

static void cram_ref_incr_locked(refs_t *r, int id) {
    RP("%d INC REF %d, %d %p\n", gettid(), id, (int)(id>=0?r->ref_id[id]->count+1:-999), id>=0?r->ref_id[id]->seq:(char *)1);

    if (id < 0 || !r->ref_id[id]->seq)
	return;

    if (r->last_id == id)
	r->last_id = -1;

    ++r->ref_id[id]->count;
}